

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  tempbuf *ptVar5;
  tempbuf writebuf [3];
  uint local_34;
  uint count;
  uint i;
  int newstate;
  CURLcode result;
  SingleRequest *k;
  int action_local;
  Curl_easy *data_local;
  
  i = 0;
  uVar2 = 0;
  if ((action & 1U) != 0) {
    uVar2 = 0x10;
  }
  uVar3 = 0;
  if ((action & 4U) != 0) {
    uVar3 = 0x20;
  }
  (data->req).keepon = uVar2 | uVar3 | (data->req).keepon & 0xffffffcfU;
  if ((uVar2 == 0) && ((data->state).tempcount != 0)) {
    uVar1 = (data->state).tempcount;
    for (local_34 = 0; local_34 < (data->state).tempcount; local_34 = local_34 + 1) {
      uVar4 = (ulong)local_34;
      ptVar5 = (data->state).tempwrite + local_34;
      *(char **)&writebuf[uVar4 - 1].type = ptVar5->buf;
      writebuf[uVar4].buf = (char *)ptVar5->len;
      writebuf[uVar4].len = *(size_t *)&ptVar5->type;
      (data->state).tempwrite[local_34].buf = (char *)0x0;
    }
    (data->state).tempcount = 0;
    for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
      if (i == 0) {
        i = Curl_client_chop_write
                      (data->easy_conn,(int)writebuf[local_34].len,
                       *(char **)&writebuf[(ulong)local_34 - 1].type,(size_t)writebuf[local_34].buf)
        ;
      }
      (*Curl_cfree)(*(void **)&writebuf[(ulong)local_34 - 1].type);
    }
    if (i != 0) {
      return i;
    }
  }
  if ((i == 0) && ((uVar2 | uVar3) != 0x30)) {
    Curl_expire(data,0,EXPIRE_RUN_NOW);
  }
  return i;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;

  /* first switch off both pause bits */
  int newstate = k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* set the new desired pause bits */
  newstate |= ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE) && data->state.tempcount) {
    /* there are buffers for sending that can be delivered as the receive
       pausing is lifted! */
    unsigned int i;
    unsigned int count = data->state.tempcount;
    struct tempbuf writebuf[3]; /* there can only be three */

    /* copy the structs to allow for immediate re-pausing */
    for(i=0; i < data->state.tempcount; i++) {
      writebuf[i] = data->state.tempwrite[i];
      data->state.tempwrite[i].buf = NULL;
    }
    data->state.tempcount = 0;

    for(i=0; i < count; i++) {
      /* even if one function returns error, this loops through and frees all
         buffers */
      if(!result)
        result = Curl_client_chop_write(data->easy_conn,
                                        writebuf[i].type,
                                        writebuf[i].buf,
                                        writebuf[i].len);
      free(writebuf[i].buf);
    }
    if(result)
      return result;
  }

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if(!result &&
     ((newstate&(KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
      (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) )
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

  return result;
}